

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O0

int arith_decode(j_decompress_ptr cinfo,uchar *st)

{
  byte bVar1;
  jpeg_entropy_decoder *pjVar2;
  long lVar3;
  _func_boolean_j_decompress_ptr_JBLOCKROW_ptr *p_Var4;
  byte bVar5;
  int iVar6;
  _func_boolean_j_decompress_ptr_JBLOCKROW_ptr *p_Var7;
  long lVar8;
  int local_40;
  uint local_3c;
  int data;
  int sv;
  INT32 temp;
  INT32 qe;
  uchar nm;
  uchar nl;
  arith_entropy_ptr_conflict e;
  uchar *st_local;
  j_decompress_ptr cinfo_local;
  
  pjVar2 = cinfo->entropy;
  while ((long)pjVar2[1].decode_mcu < 0x8000) {
    iVar6 = *(int *)&pjVar2[2].start_pass + -1;
    *(int *)&pjVar2[2].start_pass = iVar6;
    if (iVar6 < 0) {
      if (cinfo->unread_marker == 0) {
        local_40 = get_byte(cinfo);
        if (local_40 == 0xff) {
          do {
            iVar6 = get_byte(cinfo);
          } while (iVar6 == 0xff);
          if (iVar6 == 0) {
            local_40 = 0xff;
          }
          else {
            cinfo->unread_marker = iVar6;
            local_40 = 0;
          }
        }
      }
      else {
        local_40 = 0;
      }
      pjVar2[1].start_pass =
           (_func_void_j_decompress_ptr *)((long)pjVar2[1].start_pass << 8 | (long)local_40);
      iVar6 = *(int *)&pjVar2[2].start_pass + 8;
      *(int *)&pjVar2[2].start_pass = iVar6;
      if ((iVar6 < 0) &&
         (iVar6 = *(int *)&pjVar2[2].start_pass + 1, *(int *)&pjVar2[2].start_pass = iVar6,
         iVar6 == 0)) {
        pjVar2[1].decode_mcu = (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)0x8000;
      }
    }
    pjVar2[1].decode_mcu =
         (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)((long)pjVar2[1].decode_mcu << 1);
  }
  bVar1 = *st;
  local_3c = (uint)bVar1;
  lVar3 = jpeg_aritab[(int)(local_3c & 0x7f)];
  bVar5 = (byte)((ulong)lVar3 >> 8);
  p_Var7 = (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)(lVar3 >> 0x10);
  p_Var4 = pjVar2[1].decode_mcu;
  pjVar2[1].decode_mcu = p_Var4 + -(long)p_Var7;
  lVar8 = (long)(p_Var4 + -(long)p_Var7) << ((byte)*(undefined4 *)&pjVar2[2].start_pass & 0x3f);
  if ((long)pjVar2[1].start_pass < lVar8) {
    if ((long)pjVar2[1].decode_mcu < 0x8000) {
      if ((long)pjVar2[1].decode_mcu < (long)p_Var7) {
        *st = bVar1 & 0x80 ^ (byte)lVar3;
        local_3c = local_3c ^ 0x80;
      }
      else {
        *st = bVar1 & 0x80 ^ bVar5;
      }
    }
  }
  else {
    pjVar2[1].start_pass = pjVar2[1].start_pass + -lVar8;
    if ((long)pjVar2[1].decode_mcu < (long)p_Var7) {
      pjVar2[1].decode_mcu = p_Var7;
      *st = bVar1 & 0x80 ^ bVar5;
    }
    else {
      pjVar2[1].decode_mcu = p_Var7;
      *st = bVar1 & 0x80 ^ (byte)lVar3;
      local_3c = local_3c ^ 0x80;
    }
  }
  return (int)local_3c >> 7;
}

Assistant:

LOCAL(int)
arith_decode (j_decompress_ptr cinfo, unsigned char *st)
{
  register arith_entropy_ptr e = (arith_entropy_ptr) cinfo->entropy;
  register unsigned char nl, nm;
  register INT32 qe, temp;
  register int sv, data;

  /* Renormalization & data input per section D.2.6 */
  while (e->a < 0x8000L) {
    if (--e->ct < 0) {
      /* Need to fetch next data byte */
      if (cinfo->unread_marker)
	data = 0;		/* stuff zero data */
      else {
	data = get_byte(cinfo);	/* read next input byte */
	if (data == 0xFF) {	/* zero stuff or marker code */
	  do data = get_byte(cinfo);
	  while (data == 0xFF);	/* swallow extra 0xFF bytes */
	  if (data == 0)
	    data = 0xFF;	/* discard stuffed zero byte */
	  else {
	    /* Note: Different from the Huffman decoder, hitting
	     * a marker while processing the compressed data
	     * segment is legal in arithmetic coding.
	     * The convention is to supply zero data
	     * then until decoding is complete.
	     */
	    cinfo->unread_marker = data;
	    data = 0;
	  }
	}
      }
      e->c = (e->c << 8) | data; /* insert data into C register */
      if ((e->ct += 8) < 0)	 /* update bit shift counter */
	/* Need more initial bytes */
	if (++e->ct == 0)
	  /* Got 2 initial bytes -> re-init A and exit loop */
	  e->a = 0x8000L; /* => e->a = 0x10000L after loop exit */
    }
    e->a <<= 1;
  }

  /* Fetch values from our compact representation of Table D.3(D.2):
   * Qe values and probability estimation state machine
   */
  sv = *st;
  qe = jpeg_aritab[sv & 0x7F];	/* => Qe_Value */
  nl = qe & 0xFF; qe >>= 8;	/* Next_Index_LPS + Switch_MPS */
  nm = qe & 0xFF; qe >>= 8;	/* Next_Index_MPS */

  /* Decode & estimation procedures per sections D.2.4 & D.2.5 */
  temp = e->a - qe;
  e->a = temp;
  temp <<= e->ct;
  if (e->c >= temp) {
    e->c -= temp;
    /* Conditional LPS (less probable symbol) exchange */
    if (e->a < qe) {
      e->a = qe;
      *st = (sv & 0x80) ^ nm;	/* Estimate_after_MPS */
    } else {
      e->a = qe;
      *st = (sv & 0x80) ^ nl;	/* Estimate_after_LPS */
      sv ^= 0x80;		/* Exchange LPS/MPS */
    }
  } else if (e->a < 0x8000L) {
    /* Conditional MPS (more probable symbol) exchange */
    if (e->a < qe) {
      *st = (sv & 0x80) ^ nl;	/* Estimate_after_LPS */
      sv ^= 0x80;		/* Exchange LPS/MPS */
    } else {
      *st = (sv & 0x80) ^ nm;	/* Estimate_after_MPS */
    }
  }

  return sv >> 7;
}